

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_squo
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel)

{
  csubstr sp;
  csubstr sp_00;
  csubstr sp_01;
  bool bVar1;
  error_flags eVar2;
  long in_RCX;
  basic_substring<const_char> *in_RDX;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  csubstr sub_1;
  size_t lv;
  csubstr sub;
  size_t i;
  size_t pos;
  char in_stack_fffffffffffffdcf;
  undefined4 in_stack_fffffffffffffdd0;
  error_flags in_stack_fffffffffffffdd4;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdd8;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  undefined4 in_stack_fffffffffffffde0;
  error_flags in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  error_flags in_stack_fffffffffffffdec;
  basic_substring<const_char> *in_stack_fffffffffffffdf0;
  basic_substring<const_char> *local_1d8;
  ulong local_178;
  basic_substring<const_char> *local_150;
  basic_substring<const_char> *local_148;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  char *local_120;
  undefined4 local_118;
  basic_substring<const_char> *local_110;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_108;
  char *local_f0;
  undefined4 local_e8;
  basic_substring<const_char> *local_e0;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d8;
  char *local_d0;
  undefined4 local_c8;
  basic_substring<const_char> *local_c0;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b8;
  char *local_b0;
  undefined4 local_a8;
  char *local_a0;
  undefined4 local_98;
  char *local_90;
  undefined4 local_88;
  basic_substring<const_char> *local_80;
  basic_substring<const_char> *local_78;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_70;
  char *local_58;
  undefined4 local_50;
  char *local_48;
  undefined4 local_40;
  char *local_38;
  undefined4 local_30;
  basic_substring<const_char> *local_28;
  basic_substring<const_char> *local_20;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  
  local_148 = (basic_substring<const_char> *)0x0;
  local_130.m_stream = in_RSI;
  local_130.m_pos = (size_t)in_RDX;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
              in_stack_fffffffffffffdcf);
  for (local_150 = (basic_substring<const_char> *)0x0; local_150 < local_130.m_pos;
      local_150 = (basic_substring<const_char> *)((long)&local_150->str + 1)) {
    local_b8 = &local_130;
    local_c0 = local_150;
    if (local_130.m_pos <= local_150) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      local_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_c8 = 0x14c3;
      handle_error(0x344e8b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
    }
    if (local_130.m_stream[(long)local_c0] ==
        (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0xa) {
      local_28 = (basic_substring<const_char> *)((long)&local_150->str + 1);
      local_18 = &local_130;
      local_20 = local_148;
      if (local_130.m_pos < local_148) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        local_38 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_30 = 0x1544;
        handle_error(0x344e8b,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
      }
      if (local_28 == (basic_substring<const_char> *)0xffffffffffffffff) {
        local_1d8 = (basic_substring<const_char> *)local_130.m_pos;
      }
      else {
        local_1d8 = local_28;
      }
      local_28 = local_1d8;
      if (local_1d8 < local_20) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        local_48 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_40 = 0x1546;
        handle_error(0x344e8b,(char *)0x1546,"check failed: %s","first <= last");
      }
      if (local_130.m_pos < local_28) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        local_58 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_50 = 0x1547;
        handle_error(0x344e8b,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
      }
      basic_substring<const_char>::basic_substring
                (in_stack_fffffffffffffdf0,
                 (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      sp.str._4_4_ = in_stack_fffffffffffffde4;
      sp.str._0_4_ = in_stack_fffffffffffffde0;
      sp.len._0_4_ = in_stack_fffffffffffffde8;
      sp.len._4_4_ = in_stack_fffffffffffffdec;
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffdd8,sp);
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                  in_stack_fffffffffffffdcf);
      if ((basic_substring<const_char> *)((long)&local_150->str + 1U) < local_130.m_pos) {
        for (local_178 = 0; local_178 < in_RCX + 1U; local_178 = local_178 + 1) {
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                      in_stack_fffffffffffffdcf);
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                      in_stack_fffffffffffffdcf);
        }
      }
      local_148 = (basic_substring<const_char> *)((long)&local_150->str + 1);
    }
    else {
      local_d8 = &local_130;
      local_e0 = local_150;
      if (local_130.m_pos <= local_150) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        local_f0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_e8 = 0x14c3;
        handle_error(0x344e8b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      if (local_130.m_stream[(long)local_e0] ==
          (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x27) {
        local_80 = (basic_substring<const_char> *)((long)&local_150->str + 1);
        local_70 = &local_130;
        local_78 = local_148;
        if (local_130.m_pos < local_148) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_90 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_88 = 0x1544;
          handle_error(0x344e8b,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
        }
        in_stack_fffffffffffffdf0 = (basic_substring<const_char> *)local_130.m_pos;
        if (local_80 != (basic_substring<const_char> *)0xffffffffffffffff) {
          in_stack_fffffffffffffdf0 = local_80;
        }
        local_80 = in_stack_fffffffffffffdf0;
        if (in_stack_fffffffffffffdf0 < local_78) {
          in_stack_fffffffffffffdec = get_error_flags();
          if ((in_stack_fffffffffffffdec & 1) != 0) {
            bVar1 = is_debugger_attached();
            in_stack_fffffffffffffde8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffde8);
            if (bVar1) {
              trap_instruction();
            }
          }
          local_a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_98 = 0x1546;
          handle_error(0x344e8b,(char *)0x1546,"check failed: %s","first <= last");
        }
        if (local_130.m_pos < local_80) {
          in_stack_fffffffffffffde4 = get_error_flags();
          if ((in_stack_fffffffffffffde4 & 1) != 0) {
            bVar1 = is_debugger_attached();
            in_stack_fffffffffffffde0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffde0);
            if (bVar1) {
              trap_instruction();
            }
          }
          local_b0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_a8 = 0x1547;
          handle_error(0x344e8b,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring
                  (in_stack_fffffffffffffdf0,
                   (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                   CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        sp_00.str._4_4_ = in_stack_fffffffffffffde4;
        sp_00.str._0_4_ = in_stack_fffffffffffffde0;
        sp_00.len._0_4_ = in_stack_fffffffffffffde8;
        sp_00.len._4_4_ = in_stack_fffffffffffffdec;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffdd8,sp_00);
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                    in_stack_fffffffffffffdcf);
        local_148 = (basic_substring<const_char> *)((long)&local_150->str + 1);
      }
    }
  }
  if (local_148 < local_130.m_pos) {
    this_00 = &local_130;
    local_110 = local_148;
    local_108 = this_00;
    if (local_130.m_pos < local_148) {
      in_stack_fffffffffffffdd4 = get_error_flags();
      if ((in_stack_fffffffffffffdd4 & 1) != 0) {
        bVar1 = is_debugger_attached();
        in_stack_fffffffffffffdd0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdd0);
        if (bVar1) {
          trap_instruction();
        }
      }
      local_120 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_118 = 0x1533;
      handle_error(0x344e8b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              (in_stack_fffffffffffffdf0,
               (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    sp_01.str._4_4_ = in_stack_fffffffffffffde4;
    sp_01.str._0_4_ = in_stack_fffffffffffffde0;
    sp_01.len._0_4_ = in_stack_fffffffffffffde8;
    sp_01.len._4_4_ = in_stack_fffffffffffffdec;
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(this_00,sp_01);
  }
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
              in_stack_fffffffffffffdcf);
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_squo(csubstr s, size_t ilevel)
{
    size_t pos = 0; // tracks the last character that was already written
    this->Writer::_do_write('\'');
    for(size_t i = 0; i < s.len; ++i)
    {
        if(s[i] == '\n')
        {
            csubstr sub = s.range(pos, i+1);
            this->Writer::_do_write(sub);  // write everything up to (including) this char
            this->Writer::_do_write('\n'); // write the character again
            if(i + 1 < s.len)
                _rymlindent_nextline()     // indent the next line
            pos = i+1;
        }
        else if(s[i] == '\'')
        {
            csubstr sub = s.range(pos, i+1);
            this->Writer::_do_write(sub); // write everything up to (including) this char
            this->Writer::_do_write('\''); // write the character again
            pos = i+1;
        }
    }
    // write missing characters at the end of the string
    if(pos < s.len)
        this->Writer::_do_write(s.sub(pos));
    this->Writer::_do_write('\'');
}